

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingTermsDocid(Fts3Table *p,int bDelete,int iLangid,sqlite_int64 iDocid)

{
  int rc;
  sqlite_int64 iDocid_local;
  int iLangid_local;
  int bDelete_local;
  Fts3Table *p_local;
  
  if ((((p->iPrevDocid <= iDocid) &&
       (((iDocid != p->iPrevDocid || (p->bPrevDelete != 0)) && (p->iPrevLangid == iLangid)))) &&
      (p->nPendingData <= p->nMaxPendingData)) ||
     (p_local._4_4_ = sqlite3Fts3PendingTermsFlush(p), p_local._4_4_ == 0)) {
    p->iPrevDocid = iDocid;
    p->iPrevLangid = iLangid;
    p->bPrevDelete = bDelete;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int fts3PendingTermsDocid(
  Fts3Table *p,                   /* Full-text table handle */
  int bDelete,                    /* True if this op is a delete */
  int iLangid,                    /* Language id of row being written */
  sqlite_int64 iDocid             /* Docid of row being written */
){
  assert( iLangid>=0 );
  assert( bDelete==1 || bDelete==0 );

  /* TODO(shess) Explore whether partially flushing the buffer on
  ** forced-flush would provide better performance.  I suspect that if
  ** we ordered the doclists by size and flushed the largest until the
  ** buffer was half empty, that would let the less frequent terms
  ** generate longer doclists.
  */
  if( iDocid<p->iPrevDocid 
   || (iDocid==p->iPrevDocid && p->bPrevDelete==0)
   || p->iPrevLangid!=iLangid
   || p->nPendingData>p->nMaxPendingData 
  ){
    int rc = sqlite3Fts3PendingTermsFlush(p);
    if( rc!=SQLITE_OK ) return rc;
  }
  p->iPrevDocid = iDocid;
  p->iPrevLangid = iLangid;
  p->bPrevDelete = bDelete;
  return SQLITE_OK;
}